

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O2

string * deqp::gles3::Performance::(anonymous_namespace)::Utils::
         getInstanceNoiseVertexShader_abi_cxx11_(void)

{
  string *in_RDI;
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)in_RDI,
             "#version 300 es\nin highp vec4 a_position;\nout mediump vec3 v_bcoords;\nvoid main()\n{\n\tv_bcoords = vec3(0, 0, 0);\n\tv_bcoords[int(a_position.w)] = 1.0;\n\tvec3 noise = vec3(sin(float(gl_InstanceID)*1.05), sin(float(gl_InstanceID)*1.23), sin(float(gl_InstanceID)*1.71));\n\tgl_Position = vec4(a_position.xyz + noise * 0.005, 1.0);\n}\n"
             ,&local_9);
  return in_RDI;
}

Assistant:

string getInstanceNoiseVertexShader (void)
	{
		return "#version 300 es\n"
				"in highp vec4 a_position;\n"
				"out mediump vec3 v_bcoords;\n"
				"void main()\n"
				"{\n"
				"	v_bcoords = vec3(0, 0, 0);\n"
				"	v_bcoords[int(a_position.w)] = 1.0;\n"
				"	vec3 noise = vec3(sin(float(gl_InstanceID)*1.05), sin(float(gl_InstanceID)*1.23), sin(float(gl_InstanceID)*1.71));\n"
				"	gl_Position = vec4(a_position.xyz + noise * 0.005, 1.0);\n"
				"}\n";
	}